

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O1

wchar_t slot_by_name(player *p,char *name)

{
  equip_slot *peVar1;
  int iVar2;
  char **ppcVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = (ulong)(p->body).count;
  bVar6 = uVar5 != 0;
  if (bVar6) {
    peVar1 = (p->body).slots;
    iVar2 = strcmp(name,peVar1->name);
    if (iVar2 == 0) {
      uVar4 = 0;
    }
    else {
      ppcVar3 = &peVar1[1].name;
      uVar4 = 0;
      do {
        if (uVar5 - 1 == uVar4) goto LAB_001958b5;
        iVar2 = strcmp(name,*ppcVar3);
        ppcVar3 = ppcVar3 + 4;
        uVar4 = uVar4 + 1;
      } while (iVar2 != 0);
      bVar6 = uVar4 < uVar5;
    }
    if (bVar6) {
      return (wchar_t)uVar4;
    }
  }
LAB_001958b5:
  __assert_fail("i < p->body.count",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                ,0x3f,"int slot_by_name(struct player *, const char *)");
}

Assistant:

int slot_by_name(struct player *p, const char *name)
{
	int i;

	/* Look for the correctly named slot */
	for (i = 0; i < p->body.count; i++) {
		if (streq(name, p->body.slots[i].name)) {
			break;
		}
	}

	assert(i < p->body.count);

	/* Index for that slot */
	return i;
}